

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>
                   (string *__return_storage_ptr__,char (*a) [8],char **b,char (*args) [21],
                   char **args_1,char (*args_2) [28],char **args_3,char (*args_4) [156],
                   char **args_5,char (*args_6) [73],char **args_7,char (*args_8) [75])

{
  char *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_138;
  size_t local_120;
  char *local_118;
  undefined8 local_110;
  size_t local_108;
  char (*local_100) [21];
  undefined8 local_f8;
  size_t local_f0;
  char *local_e8;
  undefined8 local_e0;
  size_t local_d8;
  char (*local_d0) [28];
  undefined8 local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  size_t local_a8;
  char (*local_a0) [156];
  undefined8 local_98;
  size_t local_90;
  char *local_88;
  undefined8 local_80;
  size_t local_78;
  char (*local_70) [73];
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [75];
  undefined8 local_38;
  
  local_138.first._M_len = strlen(*a);
  local_138.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar1 = *b;
  local_138.first._M_str = *a;
  local_120 = strlen(pcVar1);
  local_110 = 0;
  local_118 = pcVar1;
  local_108 = strlen(*args);
  local_f8 = 0;
  pcVar1 = *args_1;
  local_100 = args;
  local_f0 = strlen(pcVar1);
  local_e0 = 0;
  local_e8 = pcVar1;
  local_d8 = strlen(*args_2);
  local_c8 = 0;
  pcVar1 = *args_3;
  local_d0 = args_2;
  local_c0 = strlen(pcVar1);
  local_b0 = 0;
  local_b8 = pcVar1;
  local_a8 = strlen(*args_4);
  local_a0 = args_4;
  local_98 = 0;
  pcVar1 = *args_5;
  local_90 = strlen(pcVar1);
  local_80 = 0;
  local_88 = pcVar1;
  local_78 = strlen(*args_6);
  local_70 = args_6;
  local_68 = 0;
  pcVar1 = *args_7;
  local_60 = strlen(pcVar1);
  local_50 = 0;
  local_58 = pcVar1;
  local_48 = strlen(*args_8);
  local_40 = args_8;
  local_38 = 0;
  views._M_len = 0xb;
  views._M_array = &local_138;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}